

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fwrite_weight_data(NetOptimize *this,Mat *data,FILE *bp)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  FILE *in_RDX;
  uchar padding [4];
  int nalign;
  int nwrite;
  Mat data_flattened;
  int p0;
  undefined4 local_78;
  int local_74;
  int local_70;
  void *local_60;
  size_t local_50;
  Allocator *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  lVar1 = ftell(in_RDX);
  ncnn::Mat::reshape((Mat *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  fwrite(local_60,local_50,(long)in_stack_ffffffffffffffcc,in_RDX);
  lVar2 = ftell(in_RDX);
  local_70 = (int)lVar2 - (int)lVar1;
  sVar3 = ::alignSize((long)local_70,4);
  local_74 = (int)sVar3;
  local_78 = 0;
  fwrite(&local_78,1,(long)(local_74 - local_70),in_RDX);
  ncnn::Mat::~Mat((Mat *)0x11a806);
  return 0;
}

Assistant:

int NetOptimize::fwrite_weight_data(const ncnn::Mat& data, FILE* bp)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.c);
    fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    int nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}